

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::Cluster::CreateBlockGroup
          (Cluster *this,longlong start_offset,longlong size,longlong discard_padding)

{
  long *plVar1;
  IMkvReader *pReader;
  BlockEntry **ppBVar2;
  Cluster *pCVar3;
  longlong lVar4;
  longlong lVar5;
  ulong size_00;
  long lVar6;
  BlockGroup *this_00;
  long lVar7;
  long lVar8;
  long len;
  longlong time;
  longlong local_78;
  longlong local_70;
  ulong local_68;
  long local_60;
  longlong local_58;
  long local_50;
  longlong local_48;
  Cluster *local_40;
  long local_38;
  
  if (this->m_entries == (BlockEntry **)0x0) {
    __assert_fail("m_entries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c12,
                  "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
  }
  if (this->m_entries_size < 1) {
    __assert_fail("m_entries_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c13,
                  "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
  }
  if (this->m_entries_count < 0) {
    __assert_fail("m_entries_count >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c14,
                  "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
  }
  local_48 = discard_padding;
  if ((ulong)this->m_entries_size <= (ulong)this->m_entries_count) {
    __assert_fail("m_entries_count < m_entries_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c15,
                  "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
  }
  pReader = this->m_pSegment->m_pReader;
  lVar8 = size + start_offset;
  local_70 = 1;
  local_68 = 0xffffffffffffffff;
  local_78 = 0;
  local_60 = -1;
  local_58 = -1;
  local_40 = this;
  while( true ) {
    pCVar3 = local_40;
    if (lVar8 <= start_offset) {
      if (local_60 < 0) {
        return -2;
      }
      if (start_offset != lVar8) {
        return -2;
      }
      if ((long)local_68 < 0) {
        __assert_fail("bsize >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1c5f,
                      "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
      }
      ppBVar2 = local_40->m_entries;
      lVar8 = local_40->m_entries_count;
      this_00 = (BlockGroup *)operator_new(0x68,(nothrow_t *)&std::nothrow);
      if (this_00 == (BlockGroup *)0x0) {
        ppBVar2[lVar8] = (BlockEntry *)0x0;
        return -1;
      }
      (this_00->super_BlockEntry).m_pCluster = pCVar3;
      (this_00->super_BlockEntry).m_index = lVar8;
      (this_00->super_BlockEntry)._vptr_BlockEntry = (_func_int **)&PTR__BlockGroup_00124c78;
      (this_00->m_block).m_start = local_60;
      (this_00->m_block).m_size = local_68;
      (this_00->m_block).m_track = 0;
      (this_00->m_block).m_timecode = -1;
      (this_00->m_block).m_flags = '\0';
      (this_00->m_block).m_frames = (Frame *)0x0;
      (this_00->m_block).m_frame_count = -1;
      (this_00->m_block).m_discard_padding = local_48;
      this_00->m_prev = local_70;
      this_00->m_next = local_78;
      this_00->m_duration = local_58;
      ppBVar2[lVar8] = (BlockEntry *)this_00;
      lVar7 = BlockGroup::Parse(this_00);
      if (lVar7 == 0) {
        plVar1 = &pCVar3->m_entries_count;
        *plVar1 = *plVar1 + 1;
        return 0;
      }
      if (ppBVar2[lVar8] != (BlockEntry *)0x0) {
        (*ppBVar2[lVar8]->_vptr_BlockEntry[1])();
      }
      ppBVar2[lVar8] = (BlockEntry *)0x0;
      return lVar7;
    }
    lVar5 = ReadID(pReader,start_offset,&local_50);
    if (lVar5 < 0) {
      return -2;
    }
    lVar7 = start_offset + local_50;
    if (lVar8 < lVar7) {
      return -2;
    }
    size_00 = ReadUInt(pReader,lVar7,&local_50);
    if ((long)size_00 < 0) {
      __assert_fail("size >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1c32,
                    "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
    }
    lVar7 = lVar7 + local_50;
    if (lVar8 < lVar7) break;
    lVar4 = local_78;
    if (lVar5 == 0x9b) {
      if (8 < size_00) {
        return -2;
      }
      local_58 = UnserializeUInt(pReader,lVar7,size_00);
      if (local_58 < 0) {
        return -2;
      }
    }
    else if (lVar5 == 0xfb) {
      if (size_00 - 9 < 0xfffffffffffffff8) {
        return -2;
      }
      lVar6 = UnserializeInt(pReader,lVar7,size_00,&local_38);
      if (lVar6 != 0) {
        __assert_fail("status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1c4c,
                      "long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)");
      }
      lVar4 = local_38;
      if (local_38 < 1) {
        lVar4 = local_78;
        local_70 = local_38;
      }
    }
    else if ((lVar5 == 0xa1) && (local_60 < 0)) {
      local_68 = size_00;
      local_60 = lVar7;
    }
    local_78 = lVar4;
    start_offset = lVar7 + size_00;
    if (lVar8 < start_offset) {
      return -2;
    }
  }
  __assert_fail("(pos + len) <= stop",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1c33,"long mkvparser::Cluster::CreateBlockGroup(long long, long long, long long)"
               );
}

Assistant:

long Cluster::CreateBlockGroup(long long start_offset, long long size,
                               long long discard_padding) {
  assert(m_entries);
  assert(m_entries_size > 0);
  assert(m_entries_count >= 0);
  assert(m_entries_count < m_entries_size);

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = start_offset;
  const long long stop = start_offset + size;

  // For WebM files, there is a bias towards previous reference times
  //(in order to support alt-ref frames, which refer back to the previous
  // keyframe).  Normally a 0 value is not possible, but here we tenatively
  // allow 0 as the value of a reference frame, with the interpretation
  // that this is a "previous" reference time.

  long long prev = 1;  // nonce
  long long next = 0;  // nonce
  long long duration = -1;  // really, this is unsigned

  long long bpos = -1;
  long long bsize = -1;

  while (pos < stop) {
    long len;
    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);  // TODO
    assert((pos + len) <= stop);

    pos += len;  // consume size

    if (id == libwebm::kMkvBlock) {
      if (bpos < 0) {  // Block ID
        bpos = pos;
        bsize = size;
      }
    } else if (id == libwebm::kMkvBlockDuration) {
      if (size > 8)
        return E_FILE_FORMAT_INVALID;

      duration = UnserializeUInt(pReader, pos, size);

      if (duration < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvReferenceBlock) {
      if (size > 8 || size <= 0)
        return E_FILE_FORMAT_INVALID;
      const long size_ = static_cast<long>(size);

      long long time;

      long status = UnserializeInt(pReader, pos, size_, time);
      assert(status == 0);
      if (status != 0)
        return -1;

      if (time <= 0)  // see note above
        prev = time;
      else
        next = time;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }
  if (bpos < 0)
    return E_FILE_FORMAT_INVALID;

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  assert(bsize >= 0);

  const long idx = m_entries_count;

  BlockEntry** const ppEntry = m_entries + idx;
  BlockEntry*& pEntry = *ppEntry;

  pEntry = new (std::nothrow)
      BlockGroup(this, idx, bpos, bsize, prev, next, duration, discard_padding);

  if (pEntry == NULL)
    return -1;  // generic error

  BlockGroup* const p = static_cast<BlockGroup*>(pEntry);

  const long status = p->Parse();

  if (status == 0) {  // success
    ++m_entries_count;
    return 0;
  }

  delete pEntry;
  pEntry = 0;

  return status;
}